

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_io.c
# Opt level: O2

int io_file_readline(lua_State *L,FILE *fp,MSize chop)

{
  TValue *pTVar1;
  uint64_t uVar2;
  char *str;
  char *pcVar3;
  size_t sVar4;
  GCstr *pGVar5;
  size_t lenx;
  MSize sz;
  uint uVar6;
  uint local_40;
  
  sz = 0x2000;
  lenx = 0;
  local_40 = 0;
  do {
    str = lj_buf_tmp(L,sz);
    pcVar3 = fgets(str + lenx,sz - (int)lenx,(FILE *)fp);
    if (pcVar3 == (char *)0x0) {
LAB_0014a2eb:
      pTVar1 = L->top;
      L->top = pTVar1 + 1;
      pGVar5 = lj_str_new(L,str,lenx);
      pTVar1->u64 = (ulong)pGVar5 | 0xfffd800000000000;
      uVar2 = (L->glref).ptr64;
      if (*(ulong *)(uVar2 + 0x18) <= *(ulong *)(uVar2 + 0x10)) {
        lj_gc_step(L);
      }
      return local_40;
    }
    sVar4 = strlen(str + lenx);
    uVar6 = (int)sVar4 + (int)lenx;
    lenx = (size_t)uVar6;
    local_40 = local_40 | uVar6;
    if ((uVar6 != 0) && (str[uVar6 - 1] == '\n')) {
      lenx = (size_t)(uVar6 - chop);
      goto LAB_0014a2eb;
    }
    sz = sz << (sz - 0x40 <= uVar6);
  } while( true );
}

Assistant:

static int io_file_readline(lua_State *L, FILE *fp, MSize chop)
{
  MSize m = LUAL_BUFFERSIZE, n = 0, ok = 0;
  char *buf;
  for (;;) {
    buf = lj_buf_tmp(L, m);
    if (fgets(buf+n, m-n, fp) == NULL) break;
    n += (MSize)strlen(buf+n);
    ok |= n;
    if (n && buf[n-1] == '\n') { n -= chop; break; }
    if (n >= m - 64) m += m;
  }
  setstrV(L, L->top++, lj_str_new(L, buf, (size_t)n));
  lj_gc_check(L);
  return (int)ok;
}